

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.H
# Opt level: O2

void __thiscall amrex::EB2::Level::Level(Level *this,IndexSpace *is,Geometry *geom)

{
  memcpy(this,geom,200);
  (this->m_ngrow).vect[0] = 0;
  (this->m_ngrow).vect[1] = 0;
  (this->m_ngrow).vect[2] = 0;
  BoxArray::BoxArray(&this->m_grids);
  BoxArray::BoxArray(&this->m_covered_grids);
  DistributionMapping::DistributionMapping(&this->m_dmap);
  MultiGFab::MultiGFab(&this->m_mgf);
  MultiFab::MultiFab(&this->m_levelset);
  FabArray<amrex::EBCellFlagFab>::FabArray(&this->m_cellflag);
  MultiFab::MultiFab(&this->m_volfrac);
  MultiFab::MultiFab(&this->m_centroid);
  MultiFab::MultiFab(&this->m_bndryarea);
  MultiFab::MultiFab(&this->m_bndrycent);
  MultiFab::MultiFab(&this->m_bndrynorm);
  std::array<amrex::MultiFab,_3UL>::array(&this->m_areafrac);
  std::array<amrex::MultiFab,_3UL>::array(&this->m_facecent);
  std::array<amrex::MultiFab,_3UL>::array(&this->m_edgecent);
  this->m_allregular = false;
  this->m_ok = false;
  this->m_parent = is;
  return;
}

Assistant:

Level (IndexSpace const* is, const Geometry& geom) : m_geom(geom), m_parent(is) {}